

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_4x8(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte *pbVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *dataptr;
  INT32 z1;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_74;
  int *local_68;
  
  memset(in_RDI,0,0x100);
  local_68 = in_RDI;
  for (local_74 = 0; local_74 < 8; local_74 = local_74 + 1) {
    pbVar9 = (byte *)(*(long *)(in_RSI + (long)local_74 * 8) + (ulong)in_EDX);
    bVar1 = *pbVar9;
    bVar2 = pbVar9[3];
    bVar3 = pbVar9[1];
    bVar4 = pbVar9[2];
    bVar5 = *pbVar9;
    bVar6 = pbVar9[3];
    bVar7 = pbVar9[1];
    bVar8 = pbVar9[2];
    *local_68 = ((uint)bVar1 + (uint)bVar2 + (uint)bVar3 + (uint)bVar4 + -0x200) * 8;
    local_68[2] = (((uint)bVar1 + (uint)bVar2) - ((uint)bVar3 + (uint)bVar4)) * 8;
    lVar10 = ((long)(int)((uint)bVar5 - (uint)bVar6) + (long)(int)((uint)bVar7 - (uint)bVar8)) *
             0x1151 + 0x200;
    local_68[1] = (int)(lVar10 + (long)(int)((uint)bVar5 - (uint)bVar6) * 0x187e >> 10);
    local_68[3] = (int)(lVar10 + (long)(int)((uint)bVar7 - (uint)bVar8) * -0x3b21 >> 10);
    local_68 = local_68 + 8;
  }
  local_68 = in_RDI;
  for (local_74 = 0; local_74 < 4; local_74 = local_74 + 1) {
    lVar10 = (long)(*local_68 + local_68[0x38]) + (long)(local_68[0x18] + local_68[0x20]) + 2;
    lVar11 = (long)(*local_68 + local_68[0x38]) - (long)(local_68[0x18] + local_68[0x20]);
    lVar12 = (long)(local_68[8] + local_68[0x30]) + (long)(local_68[0x10] + local_68[0x28]);
    lVar13 = (long)(local_68[8] + local_68[0x30]) - (long)(local_68[0x10] + local_68[0x28]);
    lVar14 = (long)(*local_68 - local_68[0x38]);
    lVar15 = (long)(local_68[8] - local_68[0x30]);
    lVar16 = (long)(local_68[0x10] - local_68[0x28]);
    lVar17 = (long)(local_68[0x18] - local_68[0x20]);
    *local_68 = (int)(lVar10 + lVar12 >> 2);
    local_68[0x20] = (int)(lVar10 - lVar12 >> 2);
    lVar10 = (lVar11 + lVar13) * 0x1151 + 0x4000;
    local_68[0x10] = (int)(lVar10 + lVar11 * 0x187e >> 0xf);
    local_68[0x30] = (int)(lVar10 + lVar13 * -0x3b21 >> 0xf);
    lVar13 = (lVar14 + lVar16 + lVar15 + lVar17) * 0x25a1 + 0x4000;
    lVar10 = (lVar14 + lVar17) * -0x1ccd;
    lVar11 = (lVar15 + lVar16) * -0x5203;
    lVar12 = lVar13 + (lVar14 + lVar16) * -0xc7c;
    lVar13 = lVar13 + (lVar15 + lVar17) * -0x3ec5;
    local_68[8] = (int)(lVar14 * 0x300b + lVar10 + lVar12 >> 0xf);
    local_68[0x18] = (int)(lVar15 * 0x6254 + lVar11 + lVar13 >> 0xf);
    local_68[0x28] = (int)(lVar16 * 0x41b3 + lVar11 + lVar12 >> 0xf);
    local_68[0x38] = (int)(lVar17 * 0x98e + lVar10 + lVar13 >> 0xf);
    local_68 = local_68 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_4x8 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  INT32 tmp10, tmp11, tmp12, tmp13;
  INT32 z1;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We must also scale the output by 8/4 = 2, which we add here. */
  /* 4-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16). */

  dataptr = data;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[3]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[2]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[3]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[2]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 - 4 * CENTERJSAMPLE) << (PASS1_BITS+1));
    dataptr[2] = (DCTELEM) ((tmp0 - tmp1) << (PASS1_BITS+1));

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-PASS1_BITS-2);

    dataptr[1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS-PASS1_BITS-1);
    dataptr[3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS-PASS1_BITS-1);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];

    /* Add fudge factor here for final descale. */
    tmp10 = tmp0 + tmp3 + (ONE << (PASS1_BITS-1));
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    dataptr[DCTSIZE*0] = (DCTELEM) RIGHT_SHIFT(tmp10 + tmp11, PASS1_BITS);
    dataptr[DCTSIZE*4] = (DCTELEM) RIGHT_SHIFT(tmp10 - tmp11, PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS+PASS1_BITS-1);
    dataptr[DCTSIZE*2] = (DCTELEM)
      RIGHT_SHIFT(z1 + MULTIPLY(tmp12, FIX_0_765366865), CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*6] = (DCTELEM)
      RIGHT_SHIFT(z1 - MULTIPLY(tmp13, FIX_1_847759065), CONST_BITS+PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * 8-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS+PASS1_BITS-1);

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[DCTSIZE*1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + tmp10 + tmp12, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      RIGHT_SHIFT(tmp1 + tmp11 + tmp13, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*5] = (DCTELEM)
      RIGHT_SHIFT(tmp2 + tmp11 + tmp12, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*7] = (DCTELEM)
      RIGHT_SHIFT(tmp3 + tmp10 + tmp13, CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}